

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

bool __thiscall BanMan::Unban(BanMan *this,CNetAddr *net_addr)

{
  bool bVar1;
  long in_FS_OFFSET;
  CSubNet sub_net;
  CSubNet local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet::CSubNet(&local_50,net_addr);
  bVar1 = Unban(this,&local_50);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool BanMan::Unban(const CNetAddr& net_addr)
{
    CSubNet sub_net(net_addr);
    return Unban(sub_net);
}